

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                    *value)

{
  undefined4 uVar1;
  uint uVar2;
  ostream oVar3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  uVar7 = (value->value_).data_;
  pcVar6 = "-";
  if (-1 < (int)uVar7) {
    pcVar6 = "";
  }
  uVar10 = uVar7 >> 0x17 & 0xff;
  uVar7 = uVar7 * 2 & 0xfffffe;
  iVar5 = 0;
  if (uVar10 != 0 || uVar7 != 0) {
    iVar5 = uVar10 - 0x7f;
  }
  uVar8 = uVar7;
  if ((uVar10 != 0 || uVar7 != 0) && uVar10 == 0) {
    while( true ) {
      uVar2 = uVar8 >> 0x17;
      uVar8 = uVar8 * 2;
      if ((uVar2 & 1) != 0) break;
      iVar5 = iVar5 + -1;
    }
    uVar8 = uVar8 & 0xfffffc;
  }
  lVar9 = 6;
  for (; ((int)lVar9 != 0 && ((uVar8 & 0xf) == 0)); uVar8 = uVar8 >> 4) {
    lVar9 = lVar9 + -1;
  }
  uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  oVar3 = (ostream)std::ios::fill();
  poVar4 = std::operator<<(os,pcVar6);
  poVar4 = std::operator<<(poVar4,"0x");
  std::operator<<(poVar4,'1' - (uVar10 == 0 && uVar7 == 0));
  if ((int)lVar9 != 0) {
    poVar4 = std::operator<<(os,".");
    *(long *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = lVar9;
    poVar4 = std::operator<<(poVar4,0x30);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  }
  poVar4 = std::operator<<(os,"p");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  pcVar6 = "";
  if (-1 < iVar5) {
    pcVar6 = "+";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  std::ostream::operator<<(poVar4,iVar5);
  lVar9 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar9 + -0x18) + 0x18) = uVar1;
  lVar9 = *(long *)(lVar9 + -0x18);
  std::ios::fill();
  os[lVar9 + 0xe0] = oVar3;
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  static_assert(HF::num_used_bits != 0,
                "num_used_bits must be non-zero for a valid float");
  static_assert(HF::num_exponent_bits != 0,
                "num_exponent_bits must be non-zero for a valid float");
  static_assert(HF::num_fraction_bits != 0,
                "num_fractin_bits must be non-zero for a valid float");

  const uint_type bits = value.value().data();
  const char* const sign = (bits & HF::sign_mask) ? "-" : "";
  const uint_type exponent = static_cast<uint_type>(
      (bits & HF::exponent_mask) >> HF::num_fraction_bits);

  uint_type fraction = static_cast<uint_type>((bits & HF::fraction_encode_mask)
                                              << HF::num_overflow_bits);

  const bool is_zero = exponent == 0 && fraction == 0;
  const bool is_denorm = exponent == 0 && !is_zero;

  // exponent contains the biased exponent we have to convert it back into
  // the normal range.
  int_type int_exponent = static_cast<int_type>(exponent - HF::exponent_bias);
  // If the number is all zeros, then we actually have to NOT shift the
  // exponent.
  int_exponent = is_zero ? 0 : int_exponent;

  // If we are denorm, then start shifting, and decreasing the exponent until
  // our leading bit is 1.

  if (is_denorm) {
    while ((fraction & HF::fraction_top_bit) == 0) {
      fraction = static_cast<uint_type>(fraction << 1);
      int_exponent = static_cast<int_type>(int_exponent - 1);
    }
    // Since this is denormalized, we have to consume the leading 1 since it
    // will end up being implicit.
    fraction = static_cast<uint_type>(fraction << 1);  // eat the leading 1
    fraction &= HF::fraction_represent_mask;
  }

  uint_type fraction_nibbles = HF::fraction_nibbles;
  // We do not have to display any trailing 0s, since this represents the
  // fractional part.
  while (fraction_nibbles > 0 && (fraction & 0xF) == 0) {
    // Shift off any trailing values;
    fraction = static_cast<uint_type>(fraction >> 4);
    --fraction_nibbles;
  }

  const auto saved_flags = os.flags();
  const auto saved_fill = os.fill();

  os << sign << "0x" << (is_zero ? '0' : '1');
  if (fraction_nibbles) {
    // Make sure to keep the leading 0s in place, since this is the fractional
    // part.
    os << "." << std::setw(static_cast<int>(fraction_nibbles))
       << std::setfill('0') << std::hex << fraction;
  }
  os << "p" << std::dec << (int_exponent >= 0 ? "+" : "") << int_exponent;

  os.flags(saved_flags);
  os.fill(saved_fill);

  return os;
}